

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# koch_snowflake.c
# Opt level: O1

int main(int argc,char **argv)

{
  GLfloat (*paGVar1) [2];
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  bov_window_t *window;
  GLfloat (*coords) [2];
  GLuint *elements;
  bov_points_t *points;
  bov_order_t *order;
  ulong uVar7;
  bov_text_t *text;
  long lVar8;
  ulong uVar9;
  int i;
  int iVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  float local_94;
  float local_78 [2];
  ulong local_70;
  double local_68;
  double local_60;
  GLubyte local_58 [40];
  
  window = bov_window_new(0x400,0x280,*argv);
  window->backgroundColor[0] = 0.3;
  window->backgroundColor[1] = 0.3;
  window->backgroundColor[2] = 0.3;
  window->backgroundColor[3] = 1.0;
  coords = (GLfloat (*) [2])malloc(0x2008);
  elements = (GLuint *)malloc(0x100c);
  iVar10 = 0;
  points = bov_points_new((GLfloat (*) [2])0x0,0x401,0x88e4);
  order = bov_order_new((GLuint *)0x0,0x403,0x88e8);
  *coords = (GLfloat  [2])0xbdcccccdbf2b851e;
  coords[0x400] = (GLfloat  [2])0xbdcccccd3f2b851e;
  (points->param).fillColor[0] = 0.7;
  (points->param).fillColor[1] = 0.5;
  (points->param).fillColor[2] = 0.0;
  (points->param).fillColor[3] = 2.0;
  (points->param).outlineColor[0] = 1.0;
  (points->param).outlineColor[1] = 1.0;
  (points->param).outlineColor[2] = 1.0;
  (points->param).outlineColor[3] = 1.0;
  local_94 = 0.33;
  uVar9 = 1;
  do {
    local_70 = uVar9 * 4;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_70;
    *elements = 0;
    lVar8 = 0;
    do {
      elements[lVar8 + 1] = (int)lVar8 * SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x400)) / auVar5,0);
      lVar8 = lVar8 + 1;
    } while (uVar9 * 4 + 1 != lVar8);
    elements[uVar9 * 4 + 2] = 0x400;
    bov_order_update(order,elements,(uint)local_70 | 3);
    dVar12 = window->wtime;
    local_60 = dVar12;
    do {
      dVar12 = dVar12 - local_60;
      if (1.3 <= dVar12) {
        local_94 = local_94 * 0.33333334;
        iVar6 = 0;
        uVar9 = local_70;
        goto LAB_00105ebc;
      }
      fVar13 = (float)(dVar12 / 1.3);
      if (uVar9 != 0) {
        uVar7 = 0;
        do {
          uVar2 = elements[uVar7 * 4 + 1];
          uVar3 = elements[uVar7 * 4 + 2];
          paGVar1 = coords + elements[uVar7 * 4 + 3];
          uVar4 = elements[uVar7 * 4 + 4];
          local_78[0] = coords[elements[uVar7 * 4 + 5]][0] - coords[uVar2][0];
          local_78[1] = coords[elements[uVar7 * 4 + 5]][1] - coords[uVar2][1];
          lVar8 = 0;
          do {
            fVar11 = local_78[lVar8];
            coords[uVar3][lVar8] =
                 (1.0 - fVar13) * 0.25 * fVar11 + (fVar13 / 3.0) * fVar11 + coords[uVar2][lVar8];
            (*paGVar1)[lVar8] = fVar11 * 0.5 + coords[uVar2][lVar8];
            coords[uVar4][lVar8] =
                 fVar11 * (1.0 - fVar13) * 0.75 +
                 ((fVar13 + fVar13) / 3.0) * fVar11 + coords[uVar2][lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 == 1);
          (*paGVar1)[0] = local_78[1] * -(fVar13 * 0.28867513) + (*paGVar1)[0];
          (*paGVar1)[1] = local_78[0] * fVar13 * 0.28867513 + (*paGVar1)[1];
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar9);
      }
      local_68 = dVar12;
      bov_points_update(points,coords,0x401);
      fVar11 = (fVar13 * local_94 + fVar13 * local_94) / -3.0 + local_94;
      fVar13 = 1.5 / (fVar11 + 0.67);
      (points->param).scale[0] = fVar13;
      (points->param).scale[1] = fVar13;
      fVar11 = fVar11 * fVar13;
      (points->param).width = fVar11;
      (points->param).outlineWidth = fVar11 * 0.66;
      bov_points_draw_with_order_aux(window,points,CURVE_PROGRAM,order,0,0x7fffffff);
      bov_window_update(window);
      dVar12 = window->wtime;
      iVar6 = glfwWindowShouldClose(window->self);
    } while (iVar6 == 0);
    iVar6 = 7;
    dVar12 = local_68;
LAB_00105ebc:
    if (dVar12 < 1.3) goto LAB_00105ed4;
    iVar10 = iVar10 + 1;
  } while (iVar10 != 4);
  iVar6 = 2;
LAB_00105ed4:
  if (iVar6 != 7) {
    if (iVar6 != 2) {
      return 0;
    }
    builtin_memcpy(local_58 + 0x10,"evel reached",0xd);
    builtin_memcpy(local_58,"Max. iteration l",0x10);
    text = bov_text_new(local_58,0x88e4);
    (text->param).fillColor[0] = 0.0;
    (text->param).fillColor[1] = 0.0;
    (text->param).fillColor[2] = 0.0;
    (text->param).fillColor[3] = 0.0;
    (text->param).outlineColor[0] = 1.0;
    (text->param).outlineColor[1] = 1.0;
    (text->param).outlineColor[2] = 1.0;
    (text->param).outlineColor[3] = 1.0;
    (text->param).pos[0] = 64.0;
    (text->param).pos[1] = 64.0;
    (text->param).shift[0] = 0.0;
    (text->param).shift[1] = 0.0;
    (text->param).fontSize = 64.0;
    (text->param).boldness = 0.3;
    (text->param).outlineWidth = 1.0;
    (text->param).spaceType = PIXEL_SPACE;
    local_94 = (local_94 * -0.0 + local_94 * -0.0) / 3.0 + local_94;
    fVar13 = 1.5 / (local_94 + 0.67);
    (points->param).scale[0] = fVar13;
    (points->param).scale[1] = fVar13;
    local_94 = local_94 * fVar13;
    (points->param).width = local_94;
    (points->param).outlineWidth = local_94 * 0.66;
    bov_points_update(points,coords,0x401);
    while (iVar10 = glfwWindowShouldClose(window->self), iVar10 == 0) {
      bov_points_draw_with_order_aux(window,points,CURVE_PROGRAM,order,0,0x7fffffff);
      bov_text_draw(window,text);
      bov_window_update_and_wait_events(window);
    }
    bov_text_delete(text);
  }
  bov_order_delete(order);
  free(elements);
  bov_points_delete(points);
  free(coords);
  bov_window_delete(window);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	bov_window_t* window = bov_window_new(1024, 640, argv[0]);
	bov_window_set_color(window, (GLfloat[4]) {0.3, 0.3, 0.3, 1.0});

	const int maxIters = 5;
	const size_t maxSegment = 1ULL << (2 * maxIters); // 4^maxIter with bits operations
	const size_t maxPoints = maxSegment + 1;

	// allocations
	GLfloat (*coords)[2] = malloc(2 * sizeof(GLfloat) * maxPoints);
	GLuint* indices = malloc(sizeof(GLuint) * (maxPoints + 2));
	bov_points_t* pointset = bov_points_new(NULL, maxPoints, GL_STATIC_DRAW); // GPU mirror of coords
	bov_order_t* order = bov_order_new(NULL, maxPoints + 2, GL_DYNAMIC_DRAW); // GPU mirror of indices

	// initialization
	size_t nSegment = 1;                // nPoints = nSegment+1
	GLfloat segWidth = ORIGINAL_SEGWIDTH; // the width of each segments

	coords[0][0] = -1.0 + segWidth;
	coords[0][1] = -0.1;
	coords[maxSegment][0] = 1.0 - segWidth;
	coords[maxSegment][1] = -0.1;

	// we set those parameters once and for all, other parameters
	// will be updated during the animation
	GLfloat fillColor[4] = {1, 1, 1, 1};
	GLfloat outColor[4] = {0.7, 0.5, 0.0, 2.0};
	bov_points_set_color(pointset, outColor);
	bov_points_set_outline_color(pointset, fillColor);

	// iterations
	for(int i=0; i<maxIters-1; i++) {
		indices_update(indices, 4 * nSegment, maxSegment);
		bov_order_update(order, indices, 4 * nSegment + 3);

		// animation (here we recompute the points each times)
		double tbegin = bov_window_get_time(window);
		double tnow = tbegin;
		while(tnow - tbegin < TRANSITION_TIME) {
			// interpolation factor
			GLfloat s = (tnow - tbegin)/TRANSITION_TIME;

			coords_update(coords, indices, nSegment, s);
			bov_points_update(pointset, coords, maxPoints);
			parameters_update(pointset, segWidth, s);

			bov_curve_draw_with_order(window, pointset, order, 0, BOV_TILL_END);
			bov_window_update(window);

			tnow = bov_window_get_time(window);

			if(bov_window_should_close(window))
				goto end_of_program;
		}

		nSegment *= 4;
		segWidth *= 1.0 / 3.0;
	}

	bov_text_t* end = bov_text_new((GLubyte[]){"Max. iteration level reached"}, GL_STATIC_DRAW);
	bov_text_set_param(end, (bov_text_param_t) {
	  .spaceType = PIXEL_SPACE,
	  .fontSize = 64,
	  .pos = {64, 64},
	  .fillColor = {0},          // transparent
	  .outlineColor = {1, 1, 1, 1}, // white
	  .boldness = 0.3,
	  .outlineWidth = 1.0
	});

	parameters_update(pointset, segWidth, 0);
	bov_points_update(pointset, coords, maxPoints);

	while(!bov_window_should_close(window)) {
		bov_curve_draw_with_order(window, pointset, order, 0, BOV_TILL_END);
		bov_text_draw(window, end);
		bov_window_update_and_wait_events(window);
	}

	bov_text_delete(end);

end_of_program:

	bov_order_delete(order);
	free(indices);
	bov_points_delete(pointset);
	free(coords);
	bov_window_delete(window);

	return EXIT_SUCCESS;
}